

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Bool storeRawNames(XML_Parser parser)

{
  char *pcVar1;
  XML_Char *pXVar2;
  XML_Char *pXVar3;
  size_t __n;
  char *pcVar4;
  TAG *pTVar5;
  long lVar6;
  size_t sVar7;
  char *__dest;
  
  pTVar5 = (TAG *)&parser->m_tagStack;
  while( true ) {
    pTVar5 = pTVar5->parent;
    if (pTVar5 == (TAG *)0x0) {
      return '\x01';
    }
    lVar6 = (long)(pTVar5->name).strLen;
    pcVar4 = pTVar5->rawName;
    pcVar1 = pTVar5->buf;
    __dest = pcVar1 + lVar6 + 1;
    if (pcVar4 == __dest) break;
    lVar6 = lVar6 + 1;
    __n = (size_t)pTVar5->rawNameLength;
    if (0x7fffffffU - lVar6 < __n) {
      return '\0';
    }
    sVar7 = (size_t)(pTVar5->rawNameLength + (int)lVar6);
    if ((long)pTVar5->bufEnd - (long)pcVar1 < (long)sVar7) {
      pXVar3 = (XML_Char *)(*(parser->m_mem).realloc_fcn)(pcVar1,sVar7);
      if (pXVar3 == (XML_Char *)0x0) {
        return '\0';
      }
      pcVar4 = pTVar5->buf;
      if ((pTVar5->name).str == pcVar4) {
        (pTVar5->name).str = pXVar3;
      }
      pXVar2 = (pTVar5->name).localPart;
      if (pXVar2 != (XML_Char *)0x0) {
        (pTVar5->name).localPart = pXVar3 + ((long)pXVar2 - (long)pcVar4);
      }
      pTVar5->buf = pXVar3;
      pTVar5->bufEnd = pXVar3 + sVar7;
      __dest = pXVar3 + lVar6;
      pcVar4 = pTVar5->rawName;
      __n = (size_t)pTVar5->rawNameLength;
    }
    memcpy(__dest,pcVar4,__n);
    pTVar5->rawName = __dest;
  }
  return '\x01';
}

Assistant:

static XML_Bool
storeRawNames(XML_Parser parser) {
  TAG *tag = parser->m_tagStack;
  while (tag) {
    int bufSize;
    int nameLen = sizeof(XML_Char) * (tag->name.strLen + 1);
    size_t rawNameLen;
    char *rawNameBuf = tag->buf + nameLen;
    /* Stop if already stored.  Since m_tagStack is a stack, we can stop
       at the first entry that has already been copied; everything
       below it in the stack is already been accounted for in a
       previous call to this function.
    */
    if (tag->rawName == rawNameBuf)
      break;
    /* For re-use purposes we need to ensure that the
       size of tag->buf is a multiple of sizeof(XML_Char).
    */
    rawNameLen = ROUND_UP(tag->rawNameLength, sizeof(XML_Char));
    /* Detect and prevent integer overflow. */
    if (rawNameLen > (size_t)INT_MAX - nameLen)
      return XML_FALSE;
    bufSize = nameLen + (int)rawNameLen;
    if (bufSize > tag->bufEnd - tag->buf) {
      char *temp = (char *)REALLOC(parser, tag->buf, bufSize);
      if (temp == NULL)
        return XML_FALSE;
      /* if tag->name.str points to tag->buf (only when namespace
         processing is off) then we have to update it
      */
      if (tag->name.str == (XML_Char *)tag->buf)
        tag->name.str = (XML_Char *)temp;
      /* if tag->name.localPart is set (when namespace processing is on)
         then update it as well, since it will always point into tag->buf
      */
      if (tag->name.localPart)
        tag->name.localPart
            = (XML_Char *)temp + (tag->name.localPart - (XML_Char *)tag->buf);
      tag->buf = temp;
      tag->bufEnd = temp + bufSize;
      rawNameBuf = temp + nameLen;
    }
    memcpy(rawNameBuf, tag->rawName, tag->rawNameLength);
    tag->rawName = rawNameBuf;
    tag = tag->parent;
  }
  return XML_TRUE;
}